

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O3

Vec_Vec_t *
Cgt_ClockGatingCandidates(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars,Vec_Int_t *vUseful)

{
  Vec_Vec_t *pVVar1;
  int iVar2;
  Cgt_Man_t *p;
  Aig_Man_t *pAVar3;
  Bar_Progress_t *p_00;
  long lVar4;
  long lVar5;
  long lVar6;
  timespec ts_2;
  timespec ts;
  timespec local_78;
  Cgt_Par_t local_68;
  Vec_Int_t *local_38;
  
  local_38 = vUseful;
  iVar2 = clock_gettime(3,(timespec *)&local_68);
  lVar5 = 1;
  lVar6 = 1;
  if (-1 < iVar2) {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_68._8_8_),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_68._0_8_ * -1000000;
  }
  iVar2 = clock_gettime(3,(timespec *)&local_68);
  if (-1 < iVar2) {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_68._8_8_),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68._0_8_ * -1000000;
  }
  Aig_ManRandom(1);
  if (pPars == (Cgt_Par_t *)0x0) {
    local_68.fVeryVerbose = 0;
    local_68.nLevelMax = 0x19;
    local_68.nCandMax = 1000;
    local_68.nOdcMax = 0;
    local_68.nConfMax = 10;
    local_68.nVarsMin = 1000;
    local_68.nFlopsMin = 10;
    local_68.fAreaOnly = 0;
    local_68.fVerbose = 0;
    pPars = &local_68;
  }
  p = Cgt_ManCreate(pAig,pCare,pPars);
  p->vUseful = local_38;
  pAVar3 = Cgt_ManDeriveAigForGating(p);
  p->pFrame = pAVar3;
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  p->timeAig = p->timeAig + lVar4 + lVar6;
  iVar2 = p->pFrame->nObjs[3];
  if (iVar2 == p->pAig->nRegs) {
    p_00 = Bar_ProgressStart(_stdout,iVar2);
    if (0 < p->pFrame->nObjs[3]) {
      iVar2 = 0;
      do {
        if ((p_00 == (Bar_Progress_t *)0x0) || (p_00->nItemsNext <= iVar2)) {
          Bar_ProgressUpdate_int(p_00,iVar2,(char *)0x0);
        }
        iVar2 = Cgt_ClockGatingRange(p,iVar2);
      } while (iVar2 < p->pFrame->nObjs[3]);
    }
    Bar_ProgressStop(p_00);
    pVVar1 = p->vGatesAll;
    p->vGatesAll = (Vec_Vec_t *)0x0;
    iVar2 = clock_gettime(3,&local_78);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    p->timeTotal = lVar6 + lVar5;
    Cgt_ManStop(p);
    return pVVar1;
  }
  __assert_fail("Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtCore.c"
                ,0x105,
                "Vec_Vec_t *Cgt_ClockGatingCandidates(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Vec_t * Cgt_ClockGatingCandidates( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars, Vec_Int_t * vUseful )
{
    Bar_Progress_t * pProgress = NULL;
    Cgt_Par_t Pars; 
    Cgt_Man_t * p;
    Vec_Vec_t * vGatesAll;
    int iStart;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom( 1 );
    if ( pPars == NULL )
        Cgt_SetDefaultParams( pPars = &Pars );    
    p = Cgt_ManCreate( pAig, pCare, pPars );
    p->vUseful = vUseful;
    p->pFrame = Cgt_ManDeriveAigForGating( p );
p->timeAig += Abc_Clock() - clk;
    assert( Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig) );
    pProgress = Bar_ProgressStart( stdout, Aig_ManCoNum(p->pFrame) );
    for ( iStart = 0; iStart < Aig_ManCoNum(p->pFrame); )
    {
        Bar_ProgressUpdate( pProgress, iStart, NULL );
        iStart = Cgt_ClockGatingRange( p, iStart );
    }
    Bar_ProgressStop( pProgress );
    vGatesAll = p->vGatesAll;
    p->vGatesAll = NULL;
p->timeTotal = Abc_Clock() - clkTotal;
    Cgt_ManStop( p );
    return vGatesAll;
}